

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O0

void dlep_radio_apply_interface_settings(dlep_radio_if *interface)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_extension *ext;
  dlep_radio_if *interface_local;
  
  oonf_packet_apply_managed(&(interface->interf).udp,&(interface->interf).udp_config);
  oonf_stream_apply_managed(&interface->tcp,&interface->tcp_config);
  paVar3 = dlep_extension_get_tree();
  plVar1 = (paVar3->list_head).next;
  while( true ) {
    plVar2 = plVar1->prev;
    paVar3 = dlep_extension_get_tree();
    if (plVar2 == (paVar3->list_head).prev) break;
    if (plVar1[-3].next != (list_entity *)0x0) {
      (*(code *)plVar1[-3].next)(interface);
    }
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
dlep_radio_apply_interface_settings(struct dlep_radio_if *interface) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interface->interf.udp, &interface->interf.udp_config);
  oonf_stream_apply_managed(&interface->tcp, &interface->tcp_config);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_radio) {
      ext->cb_session_apply_radio(&interface->interf.session);
    }
  }
}